

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

bool __thiscall capnp::anon_unknown_79::Input::tryConsume(Input *this,char expected)

{
  char cVar1;
  bool bVar2;
  
  if (((this->wrapped).size_ == 0) || (*(this->wrapped).ptr == '\0')) {
    bVar2 = false;
  }
  else {
    cVar1 = nextChar(this);
    bVar2 = cVar1 == expected;
  }
  if (bVar2 != false) {
    advance(this,1);
  }
  return bVar2;
}

Assistant:

bool tryConsume(char expected) {
    bool found = !exhausted() && nextChar() == expected;
    if (found) { advance(); }

    return found;
  }